

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall wasm::PassRunner::add(PassRunner *this,string *passName)

{
  undefined8 uVar1;
  string local_40 [32];
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_20;
  string *local_18;
  string *passName_local;
  PassRunner *this_local;
  
  local_18 = passName;
  passName_local = (string *)this;
  uVar1 = ::wasm::PassRegistry::get();
  std::__cxx11::string::string(local_40,(string *)passName);
  ::wasm::PassRegistry::createPass(&local_20,uVar1,local_40);
  (**(code **)(*(long *)this + 0x10))(this,&local_20);
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_20);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void add(std::string passName) {
    doAdd(PassRegistry::get()->createPass(passName));
  }